

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O2

int32 * UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix
                  (ArenaAllocator *allocator,Char *pat,CharCount patLen,int skip)

{
  int *obj;
  int *obj_00;
  int *piVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong count;
  uint uVar5;
  
  count = (ulong)patLen;
  uVar5 = 0;
  obj = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                  ((Memory *)allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,count);
  *obj = 0;
  for (uVar4 = 1; uVar4 < count; uVar4 = uVar4 + 1) {
    while ((0 < (int)uVar5 && (pat[(int)(uVar5 * skip)] != pat[(uint)((int)uVar4 * skip)]))) {
      uVar5 = obj[(ulong)uVar5 - 1];
    }
    uVar5 = uVar5 + (pat[(int)(uVar5 * skip)] == pat[(uint)((int)uVar4 * skip)]);
    obj[uVar4] = uVar5;
  }
  uVar5 = 0;
  obj_00 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                     ((Memory *)allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,count);
  *obj_00 = 0;
  for (uVar4 = 1; uVar4 < count; uVar4 = uVar4 + 1) {
    while ((uVar3 = (~uVar5 + patLen) * skip, 0 < (int)uVar5 &&
           (pat[uVar3] != pat[(~(uint)uVar4 + patLen) * skip]))) {
      uVar5 = obj_00[(ulong)uVar5 - 1];
    }
    uVar5 = uVar5 + (pat[uVar3] == pat[(~(uint)uVar4 + patLen) * skip]);
    obj_00[uVar4] = uVar5;
  }
  piVar1 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                     ((Memory *)allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)(patLen + 1));
  for (uVar4 = 0; patLen + 1 != uVar4; uVar4 = uVar4 + 1) {
    piVar1[uVar4] = patLen - obj[patLen - 1];
  }
  for (uVar4 = 1; uVar4 <= count; uVar4 = uVar4 + 1) {
    uVar5 = patLen - obj_00[uVar4 - 1];
    iVar2 = (int)uVar4 - obj_00[uVar4 - 1];
    if (iVar2 < piVar1[uVar5]) {
      piVar1[uVar5] = iVar2;
    }
  }
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    piVar1[uVar4] = piVar1[uVar4 + 1];
  }
  Memory::DeleteArray<Memory::ArenaAllocator,int>(allocator,count,obj);
  Memory::DeleteArray<Memory::ArenaAllocator,int>(allocator,count,obj_00);
  return piVar1;
}

Assistant:

int32 * TextbookBoyerMooreSetup<C>::GetGoodSuffix(ArenaAllocator* allocator, const Char * pat, CharCount patLen, int skip)
    {
        // pat offset q |-> longest prefix of pat which is a proper suffix of pat[0..q]
        // (thanks to equivalence classes being in canonical order we only need to look at the first
        //  character of each skip grouping in the pattern)
        int32* prefix = AnewArray(allocator, int32, patLen);
        prefix[0] = 0;
        int32 k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[k * skip] != pat[q * skip])
                k = prefix[k - 1];
            if (pat[k * skip] == pat[q * skip])
                k++;
            prefix[q] = k;
        }

        // As above, but for rev(pat)
        int32* revPrefix = AnewArray(allocator, int32, patLen);
        revPrefix[0] = 0;
        k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[(patLen - k - 1) * skip] != pat[(patLen - q - 1) * skip])
                k = revPrefix[k - 1];
            if (pat[(patLen - k - 1) * skip] == pat[(patLen - q - 1) * skip])
                k++;
            revPrefix[q] = k;
        }

        // pat prefix length l |-> least shift s.t. pat[0..l-1] is not mismatched
        int32 * goodSuffix = AnewArray(allocator, int32, patLen + 1);
        for (CharCount j = 0; j <= patLen; j++)
            goodSuffix[j] = patLen - prefix[patLen - 1];
        for (CharCount l = 1; l <= patLen; l++)
        {
            CharCount j = patLen - revPrefix[l - 1];
            int32 s = l - revPrefix[l - 1];
            if (goodSuffix[j] > s)
                goodSuffix[j] = s;
        }
        // shift above one to the left
        for (CharCount j = 0; j < patLen; j++)
            goodSuffix[j] = goodSuffix[j + 1];

        AdeleteArray(allocator, patLen, prefix);
        AdeleteArray(allocator, patLen, revPrefix);

        return goodSuffix;
    }